

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::ComputeDefines
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *headTarget;
  bool bVar2;
  uint uVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string *psVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string local_2c8;
  cmValue local_2a8;
  cmValue config_compile_defs;
  cmAlphaNum local_280;
  cmAlphaNum local_250;
  undefined1 local_220 [8];
  string defPropName;
  cmValue local_1e0;
  cmValue compile_defs;
  undefined1 local_1d0 [8];
  string COMPILE_DEFINITIONS;
  char local_199;
  cmAlphaNum local_198;
  cmAlphaNum local_168;
  string local_138;
  string local_118;
  string local_e8;
  undefined1 local_c8 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  string *config_local;
  string *language_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *definesString;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&genexInterpreter.Language.field_2 + 8));
  pcVar1 = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_e8,(string *)config);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string((string *)&local_118,(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_c8,(cmLocalGenerator *)pcVar1,&local_e8,
             headTarget,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_e8);
  pcVar4 = GetGlobalGenerator(this);
  uVar3 = (*(pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x26])();
  if ((uVar3 & 1) != 0) {
    cmAlphaNum::cmAlphaNum(&local_168,"CMAKE_INTDIR=\"");
    cmAlphaNum::cmAlphaNum(&local_198,config);
    local_199 = '\"';
    cmStrCat<char>(&local_138,&local_168,&local_198,&local_199);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&genexInterpreter.Language.field_2 + 8),&local_138);
    COMPILE_DEFINITIONS.field_2._8_8_ = pVar6.first._M_node;
    std::__cxx11::string::~string((string *)&local_138);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d0,"COMPILE_DEFINITIONS",
             (allocator<char> *)((long)&compile_defs.Value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&compile_defs.Value + 7));
  local_1e0 = cmSourceFile::GetProperty(source,(string *)local_1d0);
  bVar2 = cmValue::operator_cast_to_bool(&local_1e0);
  if (bVar2) {
    pcVar1 = this->LocalGenerator;
    psVar5 = cmValue::operator*[abi_cxx11_(&local_1e0);
    std::__cxx11::string::string((string *)(defPropName.field_2._M_local_buf + 8),(string *)psVar5);
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_c8,
                        (string *)((long)&defPropName.field_2 + 8),(string *)local_1d0);
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&genexInterpreter.Language.field_2 + 8),psVar5);
    std::__cxx11::string::~string((string *)(defPropName.field_2._M_local_buf + 8));
  }
  cmAlphaNum::cmAlphaNum(&local_250,"COMPILE_DEFINITIONS_");
  cmsys::SystemTools::UpperCase((string *)&config_compile_defs,config);
  cmAlphaNum::cmAlphaNum(&local_280,(string *)&config_compile_defs);
  cmStrCat<>((string *)local_220,&local_250,&local_280);
  std::__cxx11::string::~string((string *)&config_compile_defs);
  local_2a8 = cmSourceFile::GetProperty(source,(string *)local_220);
  bVar2 = cmValue::operator_cast_to_bool(&local_2a8);
  if (bVar2) {
    pcVar1 = this->LocalGenerator;
    psVar5 = cmValue::operator*[abi_cxx11_(&local_2a8);
    std::__cxx11::string::string((string *)&local_2c8,(string *)psVar5);
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_c8,&local_2c8,(string *)local_1d0)
    ;
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&genexInterpreter.Language.field_2 + 8),psVar5);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  cmCommonTargetGenerator::GetDefines
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language,config);
  cmLocalGenerator::JoinDefines
            ((cmLocalGenerator *)this->LocalGenerator,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&genexInterpreter.Language.field_2 + 8),__return_storage_ptr__,language);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)local_1d0);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_c8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&genexInterpreter.Language.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeDefines(cmSourceFile const* source,
                                                   const std::string& language,
                                                   const std::string& config)
{
  std::set<std::string> defines;
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  // Seriously??
  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    defines.insert(cmStrCat("CMAKE_INTDIR=\"", config, '"'));
  }

  const std::string COMPILE_DEFINITIONS("COMPILE_DEFINITIONS");
  if (cmValue compile_defs = source->GetProperty(COMPILE_DEFINITIONS)) {
    this->LocalGenerator->AppendDefines(
      defines, genexInterpreter.Evaluate(*compile_defs, COMPILE_DEFINITIONS));
  }

  std::string defPropName =
    cmStrCat("COMPILE_DEFINITIONS_", cmSystemTools::UpperCase(config));
  if (cmValue config_compile_defs = source->GetProperty(defPropName)) {
    this->LocalGenerator->AppendDefines(
      defines,
      genexInterpreter.Evaluate(*config_compile_defs, COMPILE_DEFINITIONS));
  }

  std::string definesString = this->GetDefines(language, config);
  this->LocalGenerator->JoinDefines(defines, definesString, language);

  return definesString;
}